

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_private.c
# Opt level: O3

char * ERR_getErrorString(ERR_enum code)

{
  if ((int)code < 0x3c) {
    switch(code) {
    case ZSTD_error_prefix_unknown:
      return "Unknown frame descriptor";
    case ZSTD_error_prefix_unknown|ZSTD_error_GENERIC:
    case ZSTD_error_version_unsupported|ZSTD_error_GENERIC:
    case ZSTD_error_frameParameter_unsupported|ZSTD_error_GENERIC:
    case ZSTD_error_frameParameter_windowTooLarge|ZSTD_error_GENERIC:
    case 0x12:
    case 0x13:
    case ZSTD_error_corruption_detected|ZSTD_error_GENERIC:
    case ZSTD_error_checksum_wrong|ZSTD_error_GENERIC:
    case ZSTD_error_literals_headerWrong|ZSTD_error_GENERIC:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case ZSTD_error_dictionary_corrupted|ZSTD_error_GENERIC:
    case ZSTD_error_dictionary_wrong|ZSTD_error_GENERIC:
    case ZSTD_error_dictionaryCreation_failed|ZSTD_error_GENERIC:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case ZSTD_error_parameter_outOfBound|ZSTD_error_GENERIC:
    case ZSTD_error_tableLog_tooLarge|ZSTD_error_GENERIC:
    case ZSTD_error_maxSymbolValue_tooLarge|ZSTD_error_GENERIC:
    case ZSTD_error_maxSymbolValue_tooSmall|ZSTD_error_GENERIC:
      break;
    case ZSTD_error_version_unsupported:
      return "Version not supported";
    case ZSTD_error_frameParameter_unsupported:
      return "Unsupported frame parameter";
    case ZSTD_error_frameParameter_windowTooLarge:
      return "Frame requires too much memory for decoding";
    case ZSTD_error_corruption_detected:
      return "Data corruption detected";
    case ZSTD_error_checksum_wrong:
      return "Restored data doesn\'t match checksum";
    case ZSTD_error_literals_headerWrong:
      return "Header of Literals\' block doesn\'t respect format specification";
    case ZSTD_error_dictionary_corrupted:
      return "Dictionary is corrupted";
    case ZSTD_error_dictionary_wrong:
      return "Dictionary mismatch";
    case ZSTD_error_dictionaryCreation_failed:
      return "Cannot create Dictionary from provided samples";
    case ZSTD_error_parameter_unsupported:
      return "Unsupported parameter";
    case ZSTD_error_parameter_combination_unsupported:
      return "Unsupported combination of parameters";
    case ZSTD_error_parameter_outOfBound:
      return "Parameter is out of bound";
    case ZSTD_error_tableLog_tooLarge:
      return "tableLog requires too much memory : unsupported";
    case ZSTD_error_maxSymbolValue_tooLarge:
      return "Unsupported max Symbol Value : too large";
    case ZSTD_error_maxSymbolValue_tooSmall:
      return "Specified maxSymbolValue is too small";
    case ZSTD_error_stabilityCondition_notRespected:
      return "pledged buffer stability condition is not respected";
    default:
      if (code == ZSTD_error_no_error) {
        return "No error detected";
      }
      if (code == ZSTD_error_GENERIC) {
        return "Error (generic)";
      }
    }
  }
  else if ((int)code < 0x52) {
    switch(code) {
    case ZSTD_error_stage_wrong:
      return "Operation not authorized at current processing stage";
    case ZSTD_error_stage_wrong|ZSTD_error_GENERIC:
    case ZSTD_error_init_missing|ZSTD_error_GENERIC:
    case ZSTD_error_memory_allocation|ZSTD_error_GENERIC:
    case ZSTD_error_workSpace_tooSmall|ZSTD_error_GENERIC:
    case 0x44:
    case 0x45:
    case ZSTD_error_dstSize_tooSmall|ZSTD_error_GENERIC:
    case ZSTD_error_srcSize_wrong|ZSTD_error_GENERIC:
      break;
    case ZSTD_error_init_missing:
      return "Context should be init first";
    case ZSTD_error_memory_allocation:
      return "Allocation error : not enough memory";
    case ZSTD_error_workSpace_tooSmall:
      return "workSpace buffer is not large enough";
    case ZSTD_error_dstSize_tooSmall:
      return "Destination buffer is too small";
    case ZSTD_error_srcSize_wrong:
      return "Src size is incorrect";
    case ZSTD_error_dstBuffer_null:
      return "Operation on NULL destination buffer";
    default:
      if (code == ZSTD_error_noForwardProgress_destFull) {
        return "Operation made no progress over multiple calls, due to output buffer being full";
      }
    }
  }
  else {
    switch(code) {
    case ZSTD_error_frameIndex_tooLarge:
      return "Frame index is too large";
    case ZSTD_error_frameIndex_tooLarge|ZSTD_error_GENERIC:
    case ZSTD_error_seekableIO|ZSTD_error_GENERIC:
      break;
    case ZSTD_error_seekableIO:
      return "An I/O error occurred when reading/seeking";
    case ZSTD_error_dstBuffer_wrong:
      return "Destination buffer is wrong";
    case ZSTD_error_srcBuffer_wrong:
      return "Source buffer is wrong";
    case ZSTD_error_sequenceProducer_failed:
      return "Block-level external sequence producer returned an error code";
    case ZSTD_error_externalSequences_invalid:
      return "External sequences are not valid";
    default:
      if (code == ZSTD_error_noForwardProgress_inputEmpty) {
        return "Operation made no progress over multiple calls, due to input being empty";
      }
    }
  }
  return "Unspecified error code";
}

Assistant:

const char* ERR_getErrorString(ERR_enum code)
{
#ifdef ZSTD_STRIP_ERROR_STRINGS
    (void)code;
    return "Error strings stripped";
#else
    static const char* const notErrorCode = "Unspecified error code";
    switch( code )
    {
    case PREFIX(no_error): return "No error detected";
    case PREFIX(GENERIC):  return "Error (generic)";
    case PREFIX(prefix_unknown): return "Unknown frame descriptor";
    case PREFIX(version_unsupported): return "Version not supported";
    case PREFIX(frameParameter_unsupported): return "Unsupported frame parameter";
    case PREFIX(frameParameter_windowTooLarge): return "Frame requires too much memory for decoding";
    case PREFIX(corruption_detected): return "Data corruption detected";
    case PREFIX(checksum_wrong): return "Restored data doesn't match checksum";
    case PREFIX(literals_headerWrong): return "Header of Literals' block doesn't respect format specification";
    case PREFIX(parameter_unsupported): return "Unsupported parameter";
    case PREFIX(parameter_combination_unsupported): return "Unsupported combination of parameters";
    case PREFIX(parameter_outOfBound): return "Parameter is out of bound";
    case PREFIX(init_missing): return "Context should be init first";
    case PREFIX(memory_allocation): return "Allocation error : not enough memory";
    case PREFIX(workSpace_tooSmall): return "workSpace buffer is not large enough";
    case PREFIX(stage_wrong): return "Operation not authorized at current processing stage";
    case PREFIX(tableLog_tooLarge): return "tableLog requires too much memory : unsupported";
    case PREFIX(maxSymbolValue_tooLarge): return "Unsupported max Symbol Value : too large";
    case PREFIX(maxSymbolValue_tooSmall): return "Specified maxSymbolValue is too small";
    case PREFIX(stabilityCondition_notRespected): return "pledged buffer stability condition is not respected";
    case PREFIX(dictionary_corrupted): return "Dictionary is corrupted";
    case PREFIX(dictionary_wrong): return "Dictionary mismatch";
    case PREFIX(dictionaryCreation_failed): return "Cannot create Dictionary from provided samples";
    case PREFIX(dstSize_tooSmall): return "Destination buffer is too small";
    case PREFIX(srcSize_wrong): return "Src size is incorrect";
    case PREFIX(dstBuffer_null): return "Operation on NULL destination buffer";
    case PREFIX(noForwardProgress_destFull): return "Operation made no progress over multiple calls, due to output buffer being full";
    case PREFIX(noForwardProgress_inputEmpty): return "Operation made no progress over multiple calls, due to input being empty";
        /* following error codes are not stable and may be removed or changed in a future version */
    case PREFIX(frameIndex_tooLarge): return "Frame index is too large";
    case PREFIX(seekableIO): return "An I/O error occurred when reading/seeking";
    case PREFIX(dstBuffer_wrong): return "Destination buffer is wrong";
    case PREFIX(srcBuffer_wrong): return "Source buffer is wrong";
    case PREFIX(sequenceProducer_failed): return "Block-level external sequence producer returned an error code";
    case PREFIX(externalSequences_invalid): return "External sequences are not valid";
    case PREFIX(maxCode):
    default: return notErrorCode;
    }
#endif
}